

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O1

void * QArrayData::allocate
                 (QArrayData **dptr,qsizetype objectSize,qsizetype alignment,qsizetype capacity,
                 AllocationOption option)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  QArrayData *pQVar5;
  size_t __size;
  ulong headerSize;
  void *pvVar6;
  CalculateGrowingBlockSizeResult CVar7;
  
  if (capacity != 0) {
    uVar3 = 0x10;
    if (0x10 < alignment) {
      uVar3 = alignment;
    }
    headerSize = uVar3 + 2;
    if (2 < objectSize) {
      headerSize = uVar3;
    }
    if (option == Grow) {
      CVar7 = qCalculateGrowingBlockSize(capacity,objectSize,headerSize);
      capacity = CVar7.elementCount;
      __size = CVar7.size;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = objectSize;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = capacity;
      uVar3 = SUB168(auVar1 * auVar2,0);
      __size = 0xffffffffffffffff;
      if (SUB168(auVar1 * auVar2,8) == 0) {
        sVar4 = uVar3 + headerSize;
        if ((!CARRY8(uVar3,headerSize)) && (-1 < (long)sVar4)) {
          __size = sVar4;
        }
      }
    }
    if (-1 < (long)__size) {
      pQVar5 = (QArrayData *)malloc(__size);
      if (pQVar5 == (QArrayData *)0x0) {
        pvVar6 = (void *)0x0;
      }
      else {
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i = 1;
        (pQVar5->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
        super_QFlagsStorage<QArrayData::ArrayOption>.i = 0;
        pvVar6 = (void *)(-alignment & (long)&pQVar5->alloc + alignment + 7);
        pQVar5->alloc = capacity;
      }
      goto LAB_001eb855;
    }
  }
  pvVar6 = (void *)0x0;
  pQVar5 = (QArrayData *)0x0;
LAB_001eb855:
  *dptr = pQVar5;
  return pvVar6;
}

Assistant:

void *QArrayData::allocate(QArrayData **dptr, qsizetype objectSize, qsizetype alignment,
                           qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);
    // Alignment is a power of two
    Q_ASSERT(alignment >= qsizetype(alignof(QArrayData))
            && !(alignment & (alignment - 1)));

    auto r = allocateHelper(objectSize, alignment, capacity, option);
    *dptr = r.header;
    return r.data;
}